

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O2

bool __thiscall QAbstractItemView::event(QAbstractItemView *this,QEvent *event)

{
  short sVar1;
  QAbstractItemViewPrivate *this_00;
  bool bVar2;
  QWidget *this_01;
  long in_FS_OFFSET;
  undefined1 *local_48;
  undefined1 *puStack_40;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractItemViewPrivate **)(this + 8);
  sVar1 = *(short *)(event + 8);
  if (sVar1 == 9) {
    QAbstractItemViewPrivate::checkPersistentEditorFocus(this_00);
  }
  else if (sVar1 == 100) {
    (**(code **)(*(long *)this + 0x220))(this);
    if (this_00->verticalScrollModeSet == false) {
      resetVerticalScrollMode(this);
    }
    if (this_00->horizontalScrollModeSet == false) {
      resetHorizontalScrollMode(this);
    }
  }
  else if (sVar1 == 0x11) {
    QAbstractItemViewPrivate::executePostedLayout(this_00);
    if (this_00->shouldScrollToCurrentOnShow == true) {
      this_00->shouldScrollToCurrentOnShow = false;
      local_38.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      currentIndex((QModelIndex *)&local_48,this);
      if ((((-1 < (int)local_48) && (-1 < (long)local_48)) &&
          (local_38.ptr != (QAbstractItemModel *)0x0)) &&
         ((this_00->state == EditingState || (this_00->autoScroll == true)))) {
        (**(code **)(*(long *)this + 0x1e8))(this,&local_48,0);
      }
    }
  }
  else {
    if (sVar1 != 0x25) {
      if (sVar1 == 0x58) {
        this_01 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
        QWidget::update(this_01);
        goto LAB_004e24da;
      }
      if (sVar1 != 0x5a) {
        if (sVar1 == 0x61) {
          QAbstractItemViewPrivate::doDelayedItemsLayout(this_00,0);
        }
        else if (sVar1 == 0xc) {
          QAbstractItemViewPrivate::executePostedLayout(this_00);
        }
        goto LAB_004e24da;
      }
    }
    (**(code **)(*(long *)this + 0x268))(this);
  }
LAB_004e24da:
  bVar2 = QAbstractScrollArea::event((QAbstractScrollArea *)this,event);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QAbstractItemView::event(QEvent *event)
{
    Q_D(QAbstractItemView);
    switch (event->type()) {
    case QEvent::Paint:
        //we call this here because the scrollbars' visibility might be altered
        //so this can't be done in the paintEvent method
        d->executePostedLayout(); //make sure we set the layout properly
        break;
    case QEvent::Show:
        d->executePostedLayout(); //make sure we set the layout properly
        if (d->shouldScrollToCurrentOnShow) {
            d->shouldScrollToCurrentOnShow = false;
            const QModelIndex current = currentIndex();
            if (current.isValid() && (d->state == QAbstractItemView::EditingState || d->autoScroll))
                scrollTo(current);
        }
        break;
    case QEvent::LocaleChange:
        viewport()->update();
        break;
    case QEvent::LayoutDirectionChange:
    case QEvent::ApplicationLayoutDirectionChange:
        updateGeometries();
        break;
    case QEvent::StyleChange:
        doItemsLayout();
        if (!d->verticalScrollModeSet)
            resetVerticalScrollMode();
        if (!d->horizontalScrollModeSet)
            resetHorizontalScrollMode();
        break;
    case QEvent::FocusOut:
        d->checkPersistentEditorFocus();
        break;
    case QEvent::FontChange:
        d->doDelayedItemsLayout(); // the size of the items will change
        break;
    default:
        break;
    }
    return QAbstractScrollArea::event(event);
}